

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O2

int __thiscall
CVmObjBigNum::getp_sin(CVmObjBigNum *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  byte bVar1;
  ushort uVar2;
  char *pcVar3;
  char *pcVar4;
  err_frame_t *peVar5;
  CVmException *pCVar6;
  int iVar7;
  undefined8 *puVar8;
  long *plVar9;
  bool bVar10;
  CVmObjBigNum *pCVar11;
  size_t prec;
  bool bVar12;
  char *ext1;
  char *ext7;
  char *ext2;
  char *ext6;
  uint hdl7;
  uint hdl6;
  uint hdl5;
  uint hdl4;
  uint hdl3;
  uint hdl2;
  uint hdl1;
  char *ext5;
  char *ext4;
  char *ext3;
  char *new_ext;
  char *local_118;
  err_frame_t err_cur__;
  
  uVar2 = *(ushort *)(this->super_CVmObject).ext_;
  iVar7 = setup_getp_0(this,self,retval,argc,&new_ext);
  if (iVar7 == 0) {
    prec = (ulong)uVar2 + 3;
    local_118 = cache_pi(prec);
    alloc_temp_regs(prec,7,&ext1,&hdl1,&ext2,&hdl2,&ext3,&hdl3,&ext4,&hdl4,&ext5,&hdl5,&ext6,&hdl6,
                    &ext7,&hdl7);
    puVar8 = (undefined8 *)_ZTW11G_err_frame();
    err_cur__.prv_ = (err_frame_t *)*puVar8;
    plVar9 = (long *)_ZTW11G_err_frame();
    *plVar9 = (long)&err_cur__;
    err_cur__.state_ = _setjmp((__jmp_buf_tag *)err_cur__.jmpbuf_);
    pcVar4 = local_118;
    if (err_cur__.state_ == 0) {
      copy_val(ext1,(this->super_CVmObject).ext_,0);
      bVar1 = ext1[4];
      ext1[4] = bVar1 & 0xfe;
      copy_val(ext7,pcVar4,1);
      mul_by_long(ext7,2);
      while (iVar7 = compare_abs(ext1,ext7), 0 < iVar7) {
        compute_quotient_into(ext6,ext2,ext1,ext7);
        pcVar3 = ext1;
        ext1 = ext2;
        ext2 = pcVar3;
      }
      bVar12 = (bool)(bVar1 & 1);
      copy_val(ext7,pcVar4,1);
      iVar7 = compare_abs(ext1,ext7);
      if (0 < iVar7) {
        bVar12 = (bool)(bVar12 ^ 1);
        compute_abs_diff_into(ext2,ext1,ext7);
        pcVar3 = ext1;
        ext1 = ext2;
        ext2 = pcVar3;
      }
      div_by_long(ext7,2,(unsigned_long *)0x0);
      iVar7 = compare_abs(ext1,ext7);
      if (0 < iVar7) {
        bVar12 = bVar12 == false;
        copy_val(ext7,pcVar4,1);
        compute_abs_diff_into(ext2,ext1,ext7);
        pcVar3 = ext1;
        ext1 = ext2;
        ext2 = pcVar3;
      }
      bVar10 = bVar12 == false;
      if ((ext1[4] & 1U) == 0) {
        bVar10 = bVar12;
      }
      ext1[4] = ext1[4] & 0xfe;
      copy_val(ext7,pcVar4,1);
      div_by_long(ext7,4,(unsigned_long *)0x0);
      pCVar11 = (CVmObjBigNum *)ext1;
      iVar7 = compare_abs(ext1,ext7);
      if (iVar7 < 1) {
        calc_sin_series(pCVar11,new_ext,ext1,ext2,ext3,ext4,ext5,ext6,ext7);
      }
      else {
        copy_val(ext7,pcVar4,1);
        div_by_long(ext7,2,(unsigned_long *)0x0);
        pCVar11 = (CVmObjBigNum *)ext2;
        compute_abs_diff_into(ext2,ext1,ext7);
        pcVar3 = ext2;
        pcVar4 = ext1;
        ext1[4] = ext1[4] & 0xfe;
        ext1 = ext2;
        ext2 = pcVar4;
        calc_cos_series(pCVar11,new_ext,pcVar3,pcVar4,ext3,ext4,ext5,ext6,ext7);
      }
      if (bVar10 != false) {
        new_ext[4] = new_ext[4] ^ 1;
      }
      normalize(new_ext);
    }
    if (-1 < (short)err_cur__.state_) {
      err_cur__.state_ = err_cur__.state_ | 0x8000;
      release_temp_regs(7,(ulong)hdl1,(ulong)hdl2,(ulong)hdl3,(ulong)hdl4,(ulong)hdl5,(ulong)hdl6);
    }
    peVar5 = err_cur__.prv_;
    puVar8 = (undefined8 *)_ZTW11G_err_frame();
    *puVar8 = peVar5;
    if ((err_cur__.state_ & 0x4001U) != 0) {
      puVar8 = (undefined8 *)_ZTW11G_err_frame();
      if ((*(byte *)*puVar8 & 2) != 0) {
        plVar9 = (long *)_ZTW11G_err_frame();
        free(*(void **)(*plVar9 + 0x10));
      }
      pCVar6 = err_cur__.exc_;
      plVar9 = (long *)_ZTW11G_err_frame();
      *(CVmException **)(*plVar9 + 0x10) = pCVar6;
      err_rethrow();
    }
    if ((err_cur__.state_ & 2U) != 0) {
      free(err_cur__.exc_);
    }
    sp_ = sp_ + -1;
  }
  return 1;
}

Assistant:

int CVmObjBigNum::getp_sin(VMG_ vm_obj_id_t self,
                           vm_val_t *retval, uint *argc)
{
    char *new_ext;
    size_t prec = get_prec(ext_);
    uint hdl1, hdl2, hdl3, hdl4, hdl5, hdl6, hdl7;
    char *ext1, *ext2, *ext3, *ext4, *ext5, *ext6, *ext7;
    int neg_result;
    const char *pi;

    /* check arguments and set up the result */
    if (setup_getp_0(vmg_ self, retval, argc, &new_ext))
        return TRUE;

    /* cache pi */
    pi = cache_pi(prec + 3);

    /* 
     *   Allocate our temporary registers.  We'll use 1 and 2 to calculate
     *   x^n - we'll start with x^(n-2) in one, and multiply by x^2 to put
     *   the result in the other.  3 we'll use to store n!.  4 we'll use
     *   to store the result of x^n/n!, and 5 and 6 we'll swap as the
     *   master accumulator.  7 we'll use to store x^2.
     *   
     *   Allocate the temporary registers with more digits of precision
     *   than we need in the result, to ensure that accumulated rounding
     *   errors don't affect the result.  
     */
    alloc_temp_regs(prec + 3, 7,
                    &ext1, &hdl1, &ext2, &hdl2, &ext3, &hdl3,
                    &ext4, &hdl4, &ext5, &hdl5, &ext6, &hdl6, &ext7, &hdl7);

    /* protect against errors so we definitely free the registers */
    err_try
    {
        char *tmp;

        /* copy our initial value to ext1 */
        copy_val(ext1, ext_, FALSE);

        /*
         *   Note that sin(-x) = -sin(x).  If x < 0, note the negative
         *   sign and then negate the value so that we calculate sin(x)
         *   and return the negative of the result.  
         */
        neg_result = get_neg(ext1);
        set_neg(ext1, FALSE);

        /* calculate 2*pi */
        copy_val(ext7, pi, TRUE);
        mul_by_long(ext7, 2);

        /*
         *   Because we'll use a Taylor series around 0 to calculate the
         *   result, we want our value as close to the expansion point (0)
         *   as possible to speed up convergence of the series.
         *   Fortunately this is especially easy for sin() because of the
         *   periodic nature of the function.
         *   
         *   First, note that sin(2*pi*i + x) = sin(x) for all integers i,
         *   so we can reduce the argument mod 2*pi until it's in the
         *   range 0 <= x < 2*pi (we might have to do this multiple times
         *   if the number's scale exceeds its precision).  Note that we
         *   already made sure the number is positive.  
         */
        while (compare_abs(ext1, ext7) > 0)
        {
            /* divide by 2*pi, storing the remainder in r2 */
            compute_quotient_into(ext6, ext2, ext1, ext7);

            /* swap r2 into r1 for the next round */
            tmp = ext1;
            ext1 = ext2;
            ext2 = tmp;
        }

        /*
         *   Next, note that sin(x+pi) = -sin(x).  If x > pi, negate the
         *   result (again if necessary) and reduce the argument by pi.
         *   This will reduce our range to 0 <= x <= pi.  
         */
        copy_val(ext7, pi, TRUE);
        if (compare_abs(ext1, ext7) > 0)
        {
            /* negate the result */
            neg_result = !neg_result;

            /* subtract pi from the argument */
            compute_abs_diff_into(ext2, ext1, ext7);

            /* swap the result into r1 */
            tmp = ext1;
            ext1 = ext2;
            ext2 = tmp;
        }

        /*
         *   Use the fact that sin(x + pi) = -sin(x) once again: if x >
         *   pi/2, subtract pi from x to adjust the range to -pi/2 <= x <=
         *   pi/2.  
         */
        div_by_long(ext7, 2);
        if (compare_abs(ext1, ext7) > 0)
        {
            /* negate the result */
            neg_result = !neg_result;
            
            /* subtract pi from the argument */
            copy_val(ext7, pi, TRUE);
            compute_abs_diff_into(ext2, ext1, ext7);

            /* swap the result into r1 */
            tmp = ext1;
            ext1 = ext2;
            ext2 = tmp;
        }

        /* 
         *   once again, reduce our range using the sign equivalence -
         *   this will limit our range to 0 <= x <= pi/2 
         */
        if (get_neg(ext1))
            neg_result = !neg_result;
        set_neg(ext1, FALSE);

        /*
         *   Next, observe that sin(x+pi/2) = cos(x).  If x > pi/4,
         *   calculate using the cosine series instead of the sine series.
         */
        copy_val(ext7, pi, TRUE);
        div_by_long(ext7, 4);
        if (compare_abs(ext1, ext7) > 0)
        {
            /* calculate pi/2 */
            copy_val(ext7, pi, TRUE);
            div_by_long(ext7, 2);
            
            /* 
             *   subtract pi/2 - this will give us a value in the range
             *   -pi/4 <= x <= pi/4 
             */
            compute_abs_diff_into(ext2, ext1, ext7);

            /* cos(-x) = cos(x), so we can ignore the sign */
            set_neg(ext1, FALSE);

            /* swap the result into r1 */
            tmp = ext1;
            ext1 = ext2;
            ext2 = tmp;

            /* calculate the cosine series */
            calc_cos_series(vmg_ new_ext,
                            ext1, ext2, ext3, ext4, ext5, ext6, ext7);
        }
        else
        {
            /*
             *   We now have a value in the range 0 <= x <= pi/4, which
             *   will converge quickly with our Taylor series 
             */
            calc_sin_series(vmg_ new_ext,
                            ext1, ext2, ext3, ext4, ext5, ext6, ext7);
        }

        /* negate the result if necessary */
        if (neg_result)
            set_neg(new_ext, !get_neg(new_ext));

        /* normalize the result */
        normalize(new_ext);
    }